

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

int __thiscall QFileSystemModelPrivate::init(QFileSystemModelPrivate *this,EVP_PKEY_CTX *ctx)

{
  ConnectionType type;
  long in_FS_OFFSET;
  Object local_60 [8];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  __base_type _Stack_38;
  undefined1 local_30 [16];
  
  local_30._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  QTimer::setSingleShot(SUB81(&this->delayedSortTimer,0));
  qMetaTypeId<QList<std::pair<QString,QFileInfo>>>();
  local_48._8_8_ = directoryChanged;
  _Stack_38._M_p = (__pointer_type)0x0;
  type = (ConnectionType)this;
  QObjectPrivate::
  connect<void(QFileInfoGatherer::*)(QString_const&,QList<QString>const&)const,void(QFileSystemModelPrivate::*)(QString_const&,QList<QString>const&)>
            ((Object *)local_30,
             (offset_in_QFileInfoGatherer_to_subr)
             (this->fileInfoGatherer)._M_t.
             super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
             super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
             super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl,
             (Object *)QFileInfoGatherer::newListOfFiles,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  local_48._8_8_ = fileSystemChanged;
  _Stack_38._M_p = (__pointer_type)0x0;
  QObjectPrivate::
  connect<void(QFileInfoGatherer::*)(QString_const&,QList<std::pair<QString,QFileInfo>>const&),void(QFileSystemModelPrivate::*)(QString_const&,QList<std::pair<QString,QFileInfo>>const&)>
            ((Object *)local_48,
             (offset_in_QFileInfoGatherer_to_subr)
             (this->fileInfoGatherer)._M_t.
             super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
             super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
             super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl,
             (Object *)QFileInfoGatherer::updates,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  local_48._8_8_ = resolvedName;
  _Stack_38._M_p = (__pointer_type)0x0;
  QObjectPrivate::
  connect<void(QFileInfoGatherer::*)(QString_const&,QString_const&)const,void(QFileSystemModelPrivate::*)(QString_const&,QString_const&)>
            ((Object *)(local_58 + 8),
             (offset_in_QFileInfoGatherer_to_subr)
             (this->fileInfoGatherer)._M_t.
             super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
             super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
             super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl,
             (Object *)QFileInfoGatherer::nameResolved,0,type);
  QMetaObject::Connection::~Connection((Connection *)(local_58 + 8));
  local_48._8_8_ = QFileSystemModel::directoryLoaded;
  _Stack_38._M_p = (__pointer_type)0x0;
  QObject::
  connect<void(QFileInfoGatherer::*)(QString_const&),void(QFileSystemModel::*)(QString_const&)>
            ((Object *)local_58,
             (offset_in_QFileInfoGatherer_to_subr)
             (this->fileInfoGatherer)._M_t.
             super___uniq_ptr_impl<QFileInfoGatherer,_std::default_delete<QFileInfoGatherer>_>._M_t.
             super__Tuple_impl<0UL,_QFileInfoGatherer_*,_std::default_delete<QFileInfoGatherer>_>.
             super__Head_base<0UL,_QFileInfoGatherer_*,_false>._M_head_impl,
             (ContextType *)QFileInfoGatherer::directoryLoaded,
             (offset_in_QFileSystemModel_to_subr *)0x0,
             (ConnectionType)*(undefined8 *)&this->field_0x8);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  local_48._8_8_ = performDelayedSort;
  _Stack_38._M_p = (__pointer_type)0x0;
  QObjectPrivate::
  connect<void(QTimer::*)(QTimer::QPrivateSignal),void(QFileSystemModelPrivate::*)()>
            (local_60,(offset_in_QTimer_to_subr)&this->delayedSortTimer,(Object *)QTimer::timeout,0,
             type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  if (*(Data **)(in_FS_OFFSET + 0x28) == (Data *)local_30._8_8_) {
    return (int)*(Data **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::init()
{
    delayedSortTimer.setSingleShot(true);

    qRegisterMetaType<QList<std::pair<QString, QFileInfo>>>();
#if QT_CONFIG(filesystemwatcher)
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::newListOfFiles,
                            this, &QFileSystemModelPrivate::directoryChanged);
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::updates,
                            this, &QFileSystemModelPrivate::fileSystemChanged);
    QObjectPrivate::connect(fileInfoGatherer.get(), &QFileInfoGatherer::nameResolved,
                            this, &QFileSystemModelPrivate::resolvedName);
    Q_Q(QFileSystemModel);
    q->connect(fileInfoGatherer.get(), &QFileInfoGatherer::directoryLoaded,
               q, &QFileSystemModel::directoryLoaded);
#endif // filesystemwatcher
    QObjectPrivate::connect(&delayedSortTimer, &QTimer::timeout,
                            this, &QFileSystemModelPrivate::performDelayedSort,
                            Qt::QueuedConnection);
}